

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

int QFontDatabase::addApplicationFont(QString *fileName)

{
  undefined1 uVar1;
  ulong uVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  QFile f;
  QByteArray data;
  QMutexLocker<QRecursiveMutex> locker;
  undefined4 in_stack_ffffffffffffff78;
  OpenModeFlag in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar5;
  int local_6c;
  QString *in_stack_ffffffffffffffb0;
  QByteArray *in_stack_ffffffffffffffb8;
  QFontDatabasePrivate *in_stack_ffffffffffffffc0;
  QFileInfo local_38 [8];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x746dff);
  QFileInfo::QFileInfo(local_38,in_RDI);
  uVar1 = QFileInfo::isNativePath();
  uVar4 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffff80) ^ 0xff000000;
  QFileInfo::~QFileInfo(local_38);
  if ((uVar4 & 0x1000000) != 0) {
    in_stack_ffffffffffffffb8 = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    in_stack_ffffffffffffffc0 = (QFontDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&stack0xffffffffffffffb8,in_RDI);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)CONCAT44(in_stack_ffffffffffffff84,uVar4),
               in_stack_ffffffffffffff7c);
    uVar2 = QFile::open((QFlags_conflict *)&stack0xffffffffffffffb8);
    bVar3 = (uVar2 & 1) != 0;
    if (bVar3) {
      QIODevice::readAll();
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_ffffffffffffff84,uVar4),
                 (QByteArray *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QByteArray::~QByteArray((QByteArray *)0x746eb7);
    }
    else {
      local_6c = -1;
    }
    uVar5 = (uint)!bVar3;
    QFile::~QFile((QFile *)&stack0xffffffffffffffb8);
    if (uVar5 != 0) goto LAB_00746f33;
    in_stack_ffffffffffffff84 = 0;
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)CONCAT44(in_stack_ffffffffffffff84,uVar4),
             (QRecursiveMutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QFontDatabasePrivate::instance();
  local_6c = QFontDatabasePrivate::addAppFont
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb0);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)CONCAT44(1,uVar4));
LAB_00746f33:
  QByteArray::~QByteArray((QByteArray *)0x746f3d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_6c;
}

Assistant:

int QFontDatabase::addApplicationFont(const QString &fileName)
{
    QByteArray data;
    if (!QFileInfo(fileName).isNativePath()) {
        QFile f(fileName);
        if (!f.open(QIODevice::ReadOnly))
            return -1;

        Q_TRACE(QFontDatabase_addApplicationFont, fileName);

        data = f.readAll();
    }
    QMutexLocker locker(fontDatabaseMutex());
    return QFontDatabasePrivate::instance()->addAppFont(data, fileName);
}